

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GGMTree.cpp
# Opt level: O2

vector<GGMNode,_std::allocator<GGMNode>_> * __thiscall
GGMTree::min_coverage
          (vector<GGMNode,_std::allocator<GGMNode>_> *__return_storage_ptr__,GGMTree *this,
          vector<GGMNode,_std::allocator<GGMNode>_> *node_list)

{
  pointer pGVar1;
  pointer pGVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  vector<GGMNode,_std::allocator<GGMNode>_> next_level_node;
  value_type node1;
  _Vector_base<GGMNode,_std::allocator<GGMNode>_> local_b8;
  GGMTree *local_98;
  _Vector_base<GGMNode,_std::allocator<GGMNode>_> local_90;
  GGMNode local_78;
  GGMNode local_50;
  
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = 0;
  local_98 = this;
LAB_0010259d:
  do {
    while( true ) {
      uVar5 = (ulong)iVar7;
      pGVar1 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pGVar2 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar6 = (long)pGVar2 - (long)pGVar1;
      uVar3 = lVar6 >> 5;
      if (uVar3 <= uVar5) {
        if ((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
            (long)local_b8._M_impl.super__Vector_impl_data._M_start == lVar6 ||
            local_b8._M_impl.super__Vector_impl_data._M_finish ==
            local_b8._M_impl.super__Vector_impl_data._M_start) {
          (__return_storage_ptr__->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
          super__Vector_impl_data._M_start = pGVar1;
          (__return_storage_ptr__->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
          super__Vector_impl_data._M_finish = pGVar2;
          (__return_storage_ptr__->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        }
        else {
          std::vector<GGMNode,_std::allocator<GGMNode>_>::vector
                    ((vector<GGMNode,_std::allocator<GGMNode>_> *)&local_90,
                     (vector<GGMNode,_std::allocator<GGMNode>_> *)&local_b8);
          min_coverage(__return_storage_ptr__,local_98,
                       (vector<GGMNode,_std::allocator<GGMNode>_> *)&local_90);
          std::_Vector_base<GGMNode,_std::allocator<GGMNode>_>::~_Vector_base(&local_90);
        }
        std::_Vector_base<GGMNode,_std::allocator<GGMNode>_>::~_Vector_base(&local_b8);
        return __return_storage_ptr__;
      }
      pGVar2 = pGVar1 + uVar5;
      local_78.index = pGVar2->index;
      local_78.level = pGVar2->level;
      local_78.key[0] = pGVar2->key[0];
      local_78.key[1] = pGVar2->key[1];
      local_78.key[2] = pGVar2->key[2];
      local_78.key[3] = pGVar2->key[3];
      local_78.key._4_8_ = *(undefined8 *)(pGVar1[uVar5].key + 4);
      local_78._24_8_ = *(undefined8 *)(pGVar1[uVar5].key + 4 + 8);
      iVar4 = iVar7 + 1;
      uVar5 = (ulong)iVar4;
      if (uVar3 != uVar5) break;
      std::vector<GGMNode,std::allocator<GGMNode>>::emplace_back<GGMNode&>
                ((vector<GGMNode,std::allocator<GGMNode>> *)&local_b8,&local_78);
      iVar7 = iVar4;
    }
    if ((ulong)(pGVar1[uVar5].index ^ local_78.index) < 2) {
      if (local_78.level == pGVar1[uVar5].level) {
        local_50.index = local_78.index >> 1;
        local_50.level = pGVar1[uVar5].level + -1;
        local_50.key[0] = '\0';
        local_50.key[1] = '\0';
        local_50.key[2] = '\0';
        local_50.key[3] = '\0';
        local_50.key[4] = '\0';
        local_50.key[5] = '\0';
        local_50.key[6] = '\0';
        local_50.key[7] = '\0';
        local_50.key[8] = '\0';
        local_50.key[9] = '\0';
        local_50.key[10] = '\0';
        local_50.key[0xb] = '\0';
        local_50.key[0xc] = '\0';
        local_50.key[0xd] = '\0';
        local_50.key[0xe] = '\0';
        local_50.key[0xf] = '\0';
        std::vector<GGMNode,_std::allocator<GGMNode>_>::emplace_back<GGMNode>
                  ((vector<GGMNode,_std::allocator<GGMNode>_> *)&local_b8,&local_50);
        iVar7 = iVar7 + 2;
        goto LAB_0010259d;
      }
    }
    std::vector<GGMNode,std::allocator<GGMNode>>::emplace_back<GGMNode&>
              ((vector<GGMNode,std::allocator<GGMNode>> *)&local_b8,&local_78);
    iVar7 = iVar4;
  } while( true );
}

Assistant:

vector<GGMNode> GGMTree::min_coverage(vector<GGMNode> node_list) {
    vector<GGMNode> next_level_node;

    for (int i = 0; i < node_list.size(); ++i) {
        auto node1 = node_list[i];

        if(i + 1 == node_list.size()) {
            next_level_node.emplace_back(node1);
        } else {
            auto node2 = node_list[i + 1];
            // same parent in the binary path
            if(((node1.index >> 1) == (node2.index >> 1)) && (node1.level == node2.level)) {
                next_level_node.emplace_back(GGMNode(node1.index >> 1, node1.level - 1));
                i++;
            } else {
                next_level_node.emplace_back(node1);
            }
        }
    }

    // no merge return
    if (next_level_node.size() == node_list.size() || next_level_node.empty()) {
        return node_list;
    }

    return min_coverage(next_level_node);
}